

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_cross_product.cpp
# Opt level: O2

OperatorResultType __thiscall
duckdb::CrossProductExecutor::Execute(CrossProductExecutor *this,DataChunk *input,DataChunk *output)

{
  pointer pVVar1;
  pointer pVVar2;
  bool bVar3;
  OperatorResultType OVar4;
  long lVar5;
  reference pvVar6;
  reference pvVar7;
  idx_t i_1;
  DataChunk *pDVar8;
  idx_t i;
  size_type sVar9;
  
  if (this->rhs->count == 0) {
    OVar4 = FINISHED;
  }
  else {
    bVar3 = NextValue(this,input,output);
    if (bVar3) {
      pDVar8 = input;
      if (this->scan_input_chunk != false) {
        pDVar8 = &this->scan_chunk;
      }
      pVVar1 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar2 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->scan_input_chunk == true) {
        lVar5 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68;
      }
      else {
        lVar5 = 0;
      }
      output->count = pDVar8->count;
      for (sVar9 = 0; ((long)pVVar1 - (long)pVVar2) / 0x68 != sVar9; sVar9 = sVar9 + 1) {
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,lVar5 + sVar9);
        pvVar7 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,sVar9);
        Vector::Reference(pvVar6,pvVar7);
      }
      pDVar8 = &this->scan_chunk;
      if (this->scan_input_chunk != false) {
        pDVar8 = input;
      }
      pVVar1 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pVVar2 = (pDVar8->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (this->scan_input_chunk == false) {
        lVar5 = ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                       super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x68;
      }
      else {
        lVar5 = 0;
      }
      for (sVar9 = 0; ((long)pVVar1 - (long)pVVar2) / 0x68 != sVar9; sVar9 = sVar9 + 1) {
        pvVar6 = vector<duckdb::Vector,_true>::get<true>(&output->data,lVar5 + sVar9);
        pvVar7 = vector<duckdb::Vector,_true>::get<true>(&pDVar8->data,sVar9);
        ConstantVector::Reference(pvVar6,pvVar7,this->position_in_chunk,pDVar8->count);
      }
      OVar4 = HAVE_MORE_OUTPUT;
    }
    else {
      this->initialized = false;
      OVar4 = NEED_MORE_INPUT;
    }
  }
  return OVar4;
}

Assistant:

OperatorResultType CrossProductExecutor::Execute(DataChunk &input, DataChunk &output) {
	if (rhs.Count() == 0) {
		// no RHS: empty result
		return OperatorResultType::FINISHED;
	}
	if (!NextValue(input, output)) {
		// ran out of entries on the RHS
		// reset the RHS and move to the next chunk on the LHS
		initialized = false;
		return OperatorResultType::NEED_MORE_INPUT;
	}

	// set up the constant chunk
	auto &constant_chunk = scan_input_chunk ? scan_chunk : input;
	auto col_count = constant_chunk.ColumnCount();
	auto col_offset = scan_input_chunk ? input.ColumnCount() : 0;
	output.SetCardinality(constant_chunk.size());
	for (idx_t i = 0; i < col_count; i++) {
		output.data[col_offset + i].Reference(constant_chunk.data[i]);
	}

	// for the chunk that we are scanning, scan a single value from that chunk
	auto &scan = scan_input_chunk ? input : scan_chunk;
	col_count = scan.ColumnCount();
	col_offset = scan_input_chunk ? 0 : input.ColumnCount();
	for (idx_t i = 0; i < col_count; i++) {
		ConstantVector::Reference(output.data[col_offset + i], scan.data[i], position_in_chunk, scan.size());
	}
	return OperatorResultType::HAVE_MORE_OUTPUT;
}